

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::CBStringList::split(CBStringList *this,CBString *b,uchar splitChar)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  CBString local_40;
  int local_24;
  int local_20;
  int i;
  int p;
  uchar splitChar_local;
  CBString *b_local;
  CBStringList *this_local;
  
  local_20 = 0;
  i._3_1_ = splitChar;
  _p = b;
  b_local = (CBString *)this;
  do {
    local_24 = local_20;
    while ((iVar3 = local_24, iVar2 = CBString::length(_p), iVar3 < iVar2 &&
           (uVar1 = CBString::character(_p,local_24), uVar1 != i._3_1_))) {
      local_24 = local_24 + 1;
    }
    if (local_20 <= local_24) {
      CBString::CBString(&local_40,(_p->super_tagbstring).data + local_20,local_24 - local_20);
      std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::push_back
                ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)this,&local_40);
      CBString::~CBString(&local_40);
    }
    iVar3 = local_24 + 1;
    local_20 = iVar3;
    iVar2 = CBString::length(_p);
  } while (iVar3 <= iVar2);
  return;
}

Assistant:

void CBStringList::split (const CBString& b, unsigned char splitChar) {
int p, i;

	p = 0;
	do {
		for (i = p; i < b.length (); i++) {
			if (b.character (i) == splitChar) break;
		}
		if (i >= p) this->push_back (CBString (&(b.data[p]), i - p));
		p = i + 1;
	} while (p <= b.length ());
}